

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::is_tessellation_shader(Compiler *this)

{
  bool bVar1;
  ExecutionModel model;
  Compiler *this_local;
  
  model = get_execution_model(this);
  bVar1 = is_tessellation_shader(model);
  return bVar1;
}

Assistant:

bool Compiler::is_tessellation_shader() const
{
	return is_tessellation_shader(get_execution_model());
}